

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  bool bVar2;
  TIntermTyped *pTVar3;
  TIntermTyped *rightNode;
  TSourceLoc loc;
  TIntermTyped *local_50;
  TSourceLoc local_48;
  
  *node = (TIntermTyped *)0x0;
  bVar1 = acceptAssignmentExpression(this,node);
  if (bVar1) {
    bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
    bVar1 = true;
    if (bVar2) {
      do {
        local_48.column = (this->super_HlslTokenStream).token.loc.column;
        local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        local_48.name = (this->super_HlslTokenStream).token.loc.name;
        local_48.string = (this->super_HlslTokenStream).token.loc.string;
        local_48.line = (this->super_HlslTokenStream).token.loc.line;
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        local_50 = (TIntermTyped *)0x0;
        bVar1 = acceptAssignmentExpression(this,&local_50);
        if (!bVar1) {
          expected(this,"assignment expression");
          return bVar1;
        }
        pTVar3 = TIntermediate::addComma(this->intermediate,*node,local_50,&local_48);
        *node = pTVar3;
        bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptExpression(TIntermTyped*& node)
{
    node = nullptr;

    // assignment_expression
    if (! acceptAssignmentExpression(node))
        return false;

    if (! peekTokenClass(EHTokComma))
        return true;

    do {
        // ... COMMA
        TSourceLoc loc = token.loc;
        advanceToken();

        // ... assignment_expression
        TIntermTyped* rightNode = nullptr;
        if (! acceptAssignmentExpression(rightNode)) {
            expected("assignment expression");
            return false;
        }

        node = intermediate.addComma(node, rightNode, loc);

        if (! peekTokenClass(EHTokComma))
            return true;
    } while (true);
}